

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_set_update4_info(Integer g_a)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  C_Integer *pCVar9;
  global_array_t *pgVar10;
  int _d;
  int iVar11;
  Integer proc;
  logical lVar12;
  double *pdVar13;
  Integer *map;
  long lVar14;
  long lVar15;
  size_t sVar16;
  Integer IVar17;
  int *piVar18;
  undefined8 *puVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  Integer *pIVar24;
  C_Integer CVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  Integer idx;
  int _ndim_8;
  double *pdVar30;
  int _ndim;
  ulong uVar31;
  long ndim;
  int _index [7];
  double *local_580;
  Integer _hi [7];
  Integer np;
  long local_4f0;
  Integer slo_rcv [7];
  Integer shi_rcv [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer width [7];
  Integer plo_rcv [7];
  Integer plo_snd [7];
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer phi_snd [7];
  Integer lo_rcv [7];
  Integer hi_rcv [7];
  Integer dims [7];
  Integer increment [7];
  Integer index [7];
  
  proc = pnga_nodeid();
  lVar12 = pnga_has_ghosts(g_a);
  if (lVar12 != 0) {
    lVar12 = gai_check_ghost_distr(g_a);
    pgVar10 = GA;
    if (lVar12 == 0) {
      return 0;
    }
    lVar3 = g_a + 1000;
    iVar6 = GA[lVar3].elemsize;
    sVar4 = GA[lVar3].ndim;
    iVar26 = (int)sVar4;
    iVar7 = GA[lVar3].p_handle;
    iVar20 = iVar26 * 0xc + 0x28;
    iVar11 = iVar26 * 0xc + 0x2f;
    if (-1 < iVar20) {
      iVar11 = iVar20;
    }
    pdVar13 = (double *)malloc((long)(((iVar11 >> 3) + 1) * iVar26 * 2 + 1) << 3);
    pgVar10[lVar3].cache = pdVar13;
    local_580 = GA[lVar3].cache;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    ndim = (long)iVar26;
    if (0 < sVar4) {
      lVar21 = 0;
      do {
        increment[lVar21] = 0;
        width[lVar21] = GA[g_a + 1000].width[lVar21];
        dims[lVar21] = GA[g_a + 1000].dims[lVar21];
        if ((lo_loc[lVar21] == 0) && (hi_loc[lVar21] == -1)) {
          *local_580 = 0.0;
          return 0;
        }
        lVar21 = lVar21 + 1;
      } while (ndim != lVar21);
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
    }
    pdVar13 = (double *)malloc(GAnproc << 3);
    if (pdVar13 == (double *)0x0) {
      pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);
    }
    pnga_proc_topology(g_a,proc,index);
    lVar21 = 1;
    lVar22 = 1;
    if (0 < sVar4) {
      lVar14 = 0;
      do {
        lVar22 = lVar22 * ((hi_loc[lVar14] - lo_loc[lVar14]) + width[lVar14] * 2 + 1);
        lVar14 = lVar14 + 1;
      } while (ndim != lVar14);
    }
    lVar14 = (long)iVar6;
    if (0 < sVar4) {
      lVar21 = 1;
      lVar29 = 0;
      do {
        lVar15 = (lVar22 / ((hi_loc[lVar29] - lo_loc[lVar29]) + width[lVar29] * 2 + 1)) *
                 width[lVar29];
        if (lVar21 <= lVar15) {
          lVar21 = lVar15;
        }
        lVar29 = lVar29 + 1;
      } while (ndim != lVar29);
    }
    *local_580 = (double)(lVar21 * lVar14);
    if (0 < sVar4) {
      local_580 = local_580 + 1;
      lVar21 = (long)(int)proc;
      local_4f0 = 1;
      if (1 < ndim + -1) {
        local_4f0 = ndim + -1;
      }
      idx = 0;
      do {
        if (width[idx] != 0) {
          get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
          lVar12 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
          if (lVar12 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar3].name);
            sVar16 = strlen(err_string);
            sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar16 = strlen(err_string);
            iVar11 = (int)sVar16;
            IVar17 = pnga_ndim(g_a);
            if (1 < IVar17) {
              lVar22 = 1;
              do {
                sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rcv[lVar22],shi_rcv[lVar22]);
                sVar16 = strlen(err_string);
                iVar11 = (int)sVar16;
                lVar22 = lVar22 + 1;
                IVar17 = pnga_ndim(g_a);
              } while (lVar22 < IVar17);
            }
            (err_string + iVar11)[0] = ']';
            (err_string + iVar11)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          dVar8 = *pdVar13;
          local_580[2] = dVar8;
          if (-1 < iVar7) {
            local_580[2] = (double)(long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
          }
          pdVar30 = local_580 + 4;
          piVar18 = (int *)((long)local_580 + ndim * 4 + 0x20);
          plVar1 = (long *)(piVar18 + ndim);
          puVar19 = (undefined8 *)((long)plVar1 + ndim * 4 + 8);
          lVar22 = 0;
          do {
            if (idx == lVar22) {
              lo_rcv[lVar22] = hi_loc[lVar22] + 1;
              lVar29 = hi_loc[lVar22] + width[lVar22];
            }
            else {
              lo_rcv[lVar22] = lo_loc[lVar22];
              lVar29 = hi_loc[lVar22];
            }
            hi_rcv[lVar22] = lVar29;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          lVar22 = 0;
          do {
            if (idx == lVar22) {
              lVar29 = hi_rcv[lVar22];
              if (dims[lVar22] < lVar29) {
                slo_rcv[lVar22] = 1;
                lVar29 = width[lVar22];
              }
              else {
                slo_rcv[lVar22] = lo_rcv[lVar22];
              }
            }
            else {
              slo_rcv[lVar22] = lo_rcv[lVar22];
              lVar29 = hi_rcv[lVar22];
            }
            shi_rcv[lVar22] = lVar29;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          lVar12 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
          if (lVar12 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar3].name);
            sVar16 = strlen(err_string);
            sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar16 = strlen(err_string);
            iVar11 = (int)sVar16;
            IVar17 = pnga_ndim(g_a);
            if (1 < IVar17) {
              lVar22 = 1;
              do {
                sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rcv[lVar22],shi_rcv[lVar22]);
                sVar16 = strlen(err_string);
                iVar11 = (int)sVar16;
                lVar22 = lVar22 + 1;
                IVar17 = pnga_ndim(g_a);
              } while (lVar22 < IVar17);
            }
            (err_string + iVar11)[0] = ']';
            (err_string + iVar11)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          dVar8 = *pdVar13;
          local_580[3] = dVar8;
          if (-1 < iVar7) {
            local_580[3] = (double)(long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
          }
          pgVar10 = GA;
          lVar22 = 0;
          do {
            if (increment[lVar22] == 0) {
              lVar29 = width[lVar22];
              plo_snd[lVar22] = lVar29;
              pIVar24 = phi_rcv;
              if (idx == lVar22) {
                phi_snd[lVar22] = lVar29 * 2 + -1;
                plo_rcv[lVar22] = lVar29 + (hi_loc[lVar22] - lo_loc[lVar22]) + 1;
                lVar15 = (hi_loc[lVar22] - lo_loc[lVar22]) + lVar29 * 2;
              }
              else {
                lVar15 = (hi_loc[lVar22] - lo_loc[lVar22]) + lVar29;
                phi_snd[lVar22] = lVar15;
                plo_rcv[lVar22] = lVar29;
              }
            }
            else {
              plo_rcv[lVar22] = 0;
              lVar15 = (hi_loc[lVar22] - lo_loc[lVar22]) + increment[lVar22];
              phi_rcv[lVar22] = lVar15;
              plo_snd[lVar22] = 0;
              pIVar24 = phi_snd;
            }
            pIVar24[lVar22] = lVar15;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          uVar5 = GA[lVar3].ndim;
          uVar31 = (ulong)(short)uVar5;
          iVar11 = GA[lVar3].distr_type;
          if (iVar11 - 1U < 3) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar22 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar22];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
                _index[lVar22 + 1] = (int)uVar23;
                lVar22 = lVar22 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar22);
            }
            if (0 < (short)uVar5) {
              lVar22 = 0;
              do {
                iVar11 = *(int *)((long)_index + lVar22);
                lVar29 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
                *(long *)(err_string + lVar22 * 2) = lVar29 * iVar11 + 1;
                lVar29 = ((long)iVar11 + 1) * lVar29;
                *(long *)((long)_hi + lVar22 * 2) = lVar29;
                lVar15 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
                if (lVar15 <= lVar29) {
                  lVar29 = lVar15;
                }
                *(long *)((long)_hi + lVar22 * 2) = lVar29;
                lVar22 = lVar22 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar22);
            }
          }
          else if (iVar11 == 4) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar22 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar22];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
                _index[lVar22 + 1] = (int)uVar23;
                lVar22 = lVar22 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar22);
            }
            if (0 < (short)uVar5) {
              pCVar9 = GA[lVar3].mapc;
              lVar22 = 0;
              iVar11 = 0;
              do {
                iVar20 = *(int *)((long)_index + lVar22);
                lVar29 = (long)iVar11 + (long)iVar20;
                *(C_Integer *)(err_string + lVar22 * 2) = pCVar9[lVar29];
                if ((long)iVar20 < *(long *)((long)GA[lVar3].num_blocks + lVar22 * 2) + -1) {
                  lVar29 = GA[lVar3].mapc[lVar29 + 1] + -1;
                }
                else {
                  lVar29 = *(long *)((long)GA[lVar3].dims + lVar22 * 2);
                }
                *(long *)((long)_hi + lVar22 * 2) = lVar29;
                iVar11 = iVar11 + *(int *)((long)GA[lVar3].num_blocks + lVar22 * 2);
                lVar22 = lVar22 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar22);
            }
          }
          else if (iVar11 == 0) {
            if (GA[lVar3].num_rstrctd == 0) {
              if ((short)uVar5 < 1) {
                lVar22 = 1;
              }
              else {
                lVar22 = 1;
                uVar23 = 0;
                do {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar22 <= proc)) {
LAB_0017ed3a:
                if (0 < (short)uVar5) {
                  memset(err_string,0,uVar31 * 8);
LAB_0017ed6e:
                  memset(_hi,0xff,uVar31 * 8);
                }
              }
              else if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                uVar23 = 0;
                lVar22 = 0;
                IVar17 = proc;
                do {
                  lVar15 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar29 = IVar17 % lVar15;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar29 + lVar22];
                  if (lVar29 == lVar15 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar29 + lVar22 + 1] + -1;
                  }
                  lVar22 = lVar22 + lVar15;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar15;
                } while (uVar31 != uVar23);
              }
            }
            else if (proc < GA[lVar3].num_rstrctd) {
              if ((short)uVar5 < 1) {
                lVar22 = 1;
              }
              else {
                lVar22 = 1;
                uVar23 = 0;
                do {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar22 <= proc)) goto LAB_0017ed3a;
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                uVar23 = 0;
                lVar22 = 0;
                IVar17 = proc;
                do {
                  lVar15 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar29 = IVar17 % lVar15;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar29 + lVar22];
                  if (lVar29 == lVar15 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar29 + lVar22 + 1] + -1;
                  }
                  lVar22 = lVar22 + lVar15;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar15;
                } while (uVar31 != uVar23);
              }
            }
            else if (0 < (short)uVar5) {
              memset(err_string,0,(ulong)uVar5 << 3);
              goto LAB_0017ed6e;
            }
          }
          if (uVar31 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar3].width[0] * 2 + 1;
          }
          if ((short)uVar5 < 2) {
            lVar22 = 1;
            lVar29 = 0;
          }
          else {
            lVar22 = 1;
            lVar15 = 0;
            lVar29 = 0;
            do {
              lVar29 = lVar29 + plo_snd[lVar15] * lVar22;
              lVar27 = (_hi[lVar15] - hi_loc[lVar15 + -0x20]) +
                       pgVar10[g_a + 1000].width[lVar15] * 2 + 1;
              ld_loc[lVar15] = lVar27;
              lVar22 = lVar22 * lVar27;
              lVar15 = lVar15 + 1;
            } while (uVar31 - 1 != lVar15);
          }
          *local_580 = (double)(pgVar10[lVar3].ptr[proc] +
                               (long)pgVar10[lVar3].elemsize *
                               (lVar22 * plo_snd[uVar31 - 1] + lVar29));
          pgVar10 = GA;
          uVar5 = GA[lVar3].ndim;
          uVar31 = (ulong)(short)uVar5;
          iVar11 = GA[lVar3].distr_type;
          if (iVar11 - 1U < 3) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar22 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar22];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
                _index[lVar22 + 1] = (int)uVar23;
                lVar22 = lVar22 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar22);
            }
            if (0 < (short)uVar5) {
              lVar22 = 0;
              do {
                iVar11 = *(int *)((long)_index + lVar22);
                lVar29 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
                *(long *)(err_string + lVar22 * 2) = lVar29 * iVar11 + 1;
                lVar29 = ((long)iVar11 + 1) * lVar29;
                *(long *)((long)_hi + lVar22 * 2) = lVar29;
                lVar15 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
                if (lVar15 <= lVar29) {
                  lVar29 = lVar15;
                }
                *(long *)((long)_hi + lVar22 * 2) = lVar29;
                lVar22 = lVar22 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar22);
            }
          }
          else if (iVar11 == 4) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar22 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar22];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
                _index[lVar22 + 1] = (int)uVar23;
                lVar22 = lVar22 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar22);
            }
            if (0 < (short)uVar5) {
              pCVar9 = GA[lVar3].mapc;
              lVar22 = 0;
              iVar11 = 0;
              do {
                iVar20 = *(int *)((long)_index + lVar22);
                lVar29 = (long)iVar11 + (long)iVar20;
                *(C_Integer *)(err_string + lVar22 * 2) = pCVar9[lVar29];
                if ((long)iVar20 < *(long *)((long)GA[lVar3].num_blocks + lVar22 * 2) + -1) {
                  lVar29 = GA[lVar3].mapc[lVar29 + 1] + -1;
                }
                else {
                  lVar29 = *(long *)((long)GA[lVar3].dims + lVar22 * 2);
                }
                *(long *)((long)_hi + lVar22 * 2) = lVar29;
                iVar11 = iVar11 + *(int *)((long)GA[lVar3].num_blocks + lVar22 * 2);
                lVar22 = lVar22 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar22);
            }
          }
          else if (iVar11 == 0) {
            if (GA[lVar3].num_rstrctd == 0) {
              if ((short)uVar5 < 1) {
                lVar22 = 1;
              }
              else {
                lVar22 = 1;
                uVar23 = 0;
                do {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar22 <= proc)) {
LAB_0017f1ce:
                if (0 < (short)uVar5) {
                  memset(err_string,0,uVar31 * 8);
LAB_0017f202:
                  memset(_hi,0xff,uVar31 * 8);
                }
              }
              else if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                lVar22 = 0;
                uVar23 = 0;
                IVar17 = proc;
                do {
                  lVar15 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar29 = IVar17 % lVar15;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar29 + lVar22];
                  if (lVar29 == lVar15 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar29 + lVar22 + 1] + -1;
                  }
                  lVar22 = lVar22 + lVar15;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar15;
                } while (uVar31 != uVar23);
              }
            }
            else if (proc < GA[lVar3].num_rstrctd) {
              if ((short)uVar5 < 1) {
                lVar22 = 1;
              }
              else {
                lVar22 = 1;
                uVar23 = 0;
                do {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar22 <= proc)) goto LAB_0017f1ce;
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                lVar22 = 0;
                uVar23 = 0;
                IVar17 = proc;
                do {
                  lVar15 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar29 = IVar17 % lVar15;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar29 + lVar22];
                  if (lVar29 == lVar15 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar29 + lVar22 + 1] + -1;
                  }
                  lVar22 = lVar22 + lVar15;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar15;
                } while (uVar31 != uVar23);
              }
            }
            else if (0 < (short)uVar5) {
              memset(err_string,0,(ulong)uVar5 << 3);
              goto LAB_0017f202;
            }
          }
          if (uVar31 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar3].width[0] * 2 + 1;
          }
          if ((short)uVar5 < 2) {
            lVar22 = 1;
            lVar29 = 0;
          }
          else {
            lVar22 = 1;
            lVar29 = 0;
            lVar15 = 0;
            do {
              lVar29 = lVar29 + plo_rcv[lVar15] * lVar22;
              lVar27 = (_hi[lVar15] - hi_loc[lVar15 + -0x20]) +
                       pgVar10[g_a + 1000].width[lVar15] * 2 + 1;
              ld_loc[lVar15] = lVar27;
              lVar22 = lVar22 * lVar27;
              lVar15 = lVar15 + 1;
            } while (uVar31 - 1 != lVar15);
          }
          local_580[1] = (double)(pgVar10[lVar3].ptr[proc] +
                                 (long)pgVar10[lVar3].elemsize *
                                 (lVar22 * plo_rcv[uVar31 - 1] + lVar29));
          *(int *)(local_580 + 4) = iVar6;
          *(int *)((long)local_580 + ndim * 4 + 0x20) = iVar6;
          if (sVar4 != 1) {
            iVar11 = *piVar18;
            lVar22 = 0;
            do {
              IVar17 = ld_loc[lVar22];
              iVar11 = iVar11 * (int)IVar17;
              *(int *)((long)pdVar30 + ndim * 4) = iVar11;
              *(int *)pdVar30 = (int)IVar17 * *(int *)pdVar30;
              lVar22 = lVar22 + 1;
              *(int *)((long)pdVar30 + ndim * 4 + 4) = iVar11;
              *(int *)((long)pdVar30 + 4) = *(int *)pdVar30;
              pdVar30 = (double *)((long)pdVar30 + 4);
            } while (local_4f0 != lVar22);
          }
          lVar22 = 0;
          do {
            *(int *)((long)plVar1 + lVar22 * 4 + 8) =
                 ((int)phi_rcv[lVar22] - (int)plo_rcv[lVar22]) + 1;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          *plVar1 = 1;
          lVar22 = 1;
          lVar29 = 0;
          do {
            lVar22 = lVar22 * ((phi_snd[lVar29] - plo_snd[lVar29]) + 1);
            *plVar1 = lVar22;
            lVar29 = lVar29 + 1;
          } while (ndim != lVar29);
          *plVar1 = *plVar1 * lVar14;
          *(int *)(plVar1 + 1) = (int)plVar1[1] * iVar6;
          get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
          lVar12 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
          if (lVar12 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar3].name);
            sVar16 = strlen(err_string);
            sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar16 = strlen(err_string);
            iVar11 = (int)sVar16;
            IVar17 = pnga_ndim(g_a);
            if (1 < IVar17) {
              lVar22 = 1;
              do {
                sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rcv[lVar22],shi_rcv[lVar22]);
                sVar16 = strlen(err_string);
                iVar11 = (int)sVar16;
                lVar22 = lVar22 + 1;
                IVar17 = pnga_ndim(g_a);
              } while (lVar22 < IVar17);
            }
            (err_string + iVar11)[0] = ']';
            (err_string + iVar11)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          dVar8 = *pdVar13;
          *(double *)((long)plVar1 + ndim * 4 + 0x18) = dVar8;
          if (-1 < iVar7) {
            *(long *)((long)plVar1 + ndim * 4 + 0x18) =
                 (long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
          }
          lVar22 = ndim * 4 + 0x28;
          piVar18 = (int *)((long)puVar19 + (ndim + 8) * 4);
          plVar2 = (long *)(piVar18 + ndim);
          local_580 = (double *)((long)plVar2 + ndim * 4 + 8);
          lVar29 = 0;
          do {
            lVar15 = lo_loc[lVar29];
            if (idx == lVar29) {
              lo_rcv[lVar29] = lVar15 - width[lVar29];
              lVar15 = lVar15 + -1;
            }
            else {
              lo_rcv[lVar29] = lVar15;
              lVar15 = hi_loc[lVar29];
            }
            hi_rcv[lVar29] = lVar15;
            lVar29 = lVar29 + 1;
          } while (ndim != lVar29);
          lVar29 = 0;
          do {
            if (idx == lVar29) {
              lVar15 = hi_rcv[lVar29];
              if (lVar15 < 1) {
                lVar15 = dims[lVar29];
                lVar27 = (lVar15 - width[lVar29]) + 1;
              }
              else {
                lVar27 = lo_rcv[lVar29];
              }
              slo_rcv[lVar29] = lVar27;
            }
            else {
              slo_rcv[lVar29] = lo_rcv[lVar29];
              lVar15 = hi_rcv[lVar29];
            }
            shi_rcv[lVar29] = lVar15;
            lVar29 = lVar29 + 1;
          } while (ndim != lVar29);
          lVar12 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)pdVar13,&np);
          if (lVar12 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar3].name);
            sVar16 = strlen(err_string);
            sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar16 = strlen(err_string);
            iVar11 = (int)sVar16;
            IVar17 = pnga_ndim(g_a);
            if (1 < IVar17) {
              lVar29 = 1;
              do {
                sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rcv[lVar29],shi_rcv[lVar29]);
                sVar16 = strlen(err_string);
                iVar11 = (int)sVar16;
                lVar29 = lVar29 + 1;
                IVar17 = pnga_ndim(g_a);
              } while (lVar29 < IVar17);
            }
            (err_string + iVar11)[0] = ']';
            (err_string + iVar11)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          dVar8 = *pdVar13;
          *(double *)((long)plVar1 + ndim * 4 + 0x20) = dVar8;
          if (-1 < iVar7) {
            *(long *)((long)plVar1 + ndim * 4 + 0x20) =
                 (long)PGRP_LIST[iVar7].inv_map_proc_list[(long)dVar8];
          }
          pgVar10 = GA;
          lVar29 = 0;
          do {
            if (increment[lVar29] == 0) {
              pIVar24 = phi_rcv;
              if (idx == lVar29) {
                plo_snd[lVar29] = (hi_loc[lVar29] - lo_loc[lVar29]) + 1;
                phi_snd[lVar29] = (hi_loc[lVar29] - lo_loc[lVar29]) + width[lVar29];
                plo_rcv[lVar29] = 0;
                lVar27 = width[lVar29] + -1;
              }
              else {
                lVar15 = width[lVar29];
                plo_snd[lVar29] = lVar15;
                lVar27 = (hi_loc[lVar29] - lo_loc[lVar29]) + lVar15;
                phi_snd[lVar29] = lVar27;
                plo_rcv[lVar29] = lVar15;
              }
            }
            else {
              plo_rcv[lVar29] = 0;
              lVar27 = (hi_loc[lVar29] - lo_loc[lVar29]) + increment[lVar29];
              phi_rcv[lVar29] = lVar27;
              plo_snd[lVar29] = 0;
              pIVar24 = phi_snd;
            }
            pIVar24[lVar29] = lVar27;
            lVar29 = lVar29 + 1;
          } while (ndim != lVar29);
          uVar5 = GA[lVar3].ndim;
          uVar31 = (ulong)(short)uVar5;
          iVar11 = GA[lVar3].distr_type;
          if (iVar11 - 1U < 3) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar29 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar29];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar29 + 1];
                _index[lVar29 + 1] = (int)uVar23;
                lVar29 = lVar29 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar29);
            }
            if (0 < (short)uVar5) {
              lVar29 = 0;
              do {
                iVar11 = *(int *)((long)_index + lVar29);
                lVar15 = *(long *)((long)GA[g_a + 1000].block_dims + lVar29 * 2);
                *(long *)(err_string + lVar29 * 2) = lVar15 * iVar11 + 1;
                lVar15 = ((long)iVar11 + 1) * lVar15;
                *(long *)((long)_hi + lVar29 * 2) = lVar15;
                lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar29 * 2);
                if (lVar27 <= lVar15) {
                  lVar15 = lVar27;
                }
                *(long *)((long)_hi + lVar29 * 2) = lVar15;
                lVar29 = lVar29 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar29);
            }
          }
          else if (iVar11 == 4) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar29 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar29];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar29 + 1];
                _index[lVar29 + 1] = (int)uVar23;
                lVar29 = lVar29 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar29);
            }
            if (0 < (short)uVar5) {
              pCVar9 = GA[lVar3].mapc;
              lVar29 = 0;
              iVar11 = 0;
              do {
                iVar20 = *(int *)((long)_index + lVar29);
                lVar15 = (long)iVar11 + (long)iVar20;
                *(C_Integer *)(err_string + lVar29 * 2) = pCVar9[lVar15];
                if ((long)iVar20 < *(long *)((long)GA[lVar3].num_blocks + lVar29 * 2) + -1) {
                  lVar15 = GA[lVar3].mapc[lVar15 + 1] + -1;
                }
                else {
                  lVar15 = *(long *)((long)GA[lVar3].dims + lVar29 * 2);
                }
                *(long *)((long)_hi + lVar29 * 2) = lVar15;
                iVar11 = iVar11 + *(int *)((long)GA[lVar3].num_blocks + lVar29 * 2);
                lVar29 = lVar29 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar29);
            }
          }
          else if (iVar11 == 0) {
            if (GA[lVar3].num_rstrctd == 0) {
              if ((short)uVar5 < 1) {
                lVar29 = 1;
              }
              else {
                lVar29 = 1;
                uVar23 = 0;
                do {
                  lVar29 = lVar29 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar29 <= proc)) {
LAB_0017fc9b:
                if (0 < (short)uVar5) {
                  memset(err_string,0,uVar31 * 8);
LAB_0017fcd5:
                  memset(_hi,0xff,uVar31 * 8);
                }
              }
              else if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                lVar29 = 0;
                uVar23 = 0;
                IVar17 = proc;
                do {
                  lVar27 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar15 = IVar17 % lVar27;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar15 + lVar29];
                  if (lVar15 == lVar27 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar15 + lVar29 + 1] + -1;
                  }
                  lVar29 = lVar29 + lVar27;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar27;
                } while (uVar31 != uVar23);
              }
            }
            else if (proc < GA[lVar3].num_rstrctd) {
              if ((short)uVar5 < 1) {
                lVar29 = 1;
              }
              else {
                lVar29 = 1;
                uVar23 = 0;
                do {
                  lVar29 = lVar29 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar29 <= proc)) goto LAB_0017fc9b;
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                lVar29 = 0;
                uVar23 = 0;
                IVar17 = proc;
                do {
                  lVar27 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar15 = IVar17 % lVar27;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar15 + lVar29];
                  if (lVar15 == lVar27 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar15 + lVar29 + 1] + -1;
                  }
                  lVar29 = lVar29 + lVar27;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar27;
                } while (uVar31 != uVar23);
              }
            }
            else if (0 < (short)uVar5) {
              memset(err_string,0,(ulong)uVar5 << 3);
              goto LAB_0017fcd5;
            }
          }
          if (uVar31 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar3].width[0] * 2 + 1;
          }
          if ((short)uVar5 < 2) {
            lVar29 = 1;
            lVar15 = 0;
          }
          else {
            lVar29 = 1;
            lVar15 = 0;
            lVar27 = 0;
            do {
              lVar15 = lVar15 + plo_snd[lVar27] * lVar29;
              lVar28 = (_hi[lVar27] - hi_loc[lVar27 + -0x20]) +
                       pgVar10[g_a + 1000].width[lVar27] * 2 + 1;
              ld_loc[lVar27] = lVar28;
              lVar29 = lVar29 * lVar28;
              lVar27 = lVar27 + 1;
            } while (uVar31 - 1 != lVar27);
          }
          *puVar19 = pgVar10[lVar3].ptr[proc] +
                     (long)pgVar10[lVar3].elemsize * (lVar29 * plo_snd[uVar31 - 1] + lVar15);
          pgVar10 = GA;
          uVar5 = GA[lVar3].ndim;
          uVar31 = (ulong)(short)uVar5;
          iVar11 = GA[lVar3].distr_type;
          if (iVar11 - 1U < 3) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar29 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar29];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar29 + 1];
                _index[lVar29 + 1] = (int)uVar23;
                lVar29 = lVar29 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar29);
            }
            if (0 < (short)uVar5) {
              lVar29 = 0;
              do {
                iVar11 = *(int *)((long)_index + lVar29);
                lVar15 = *(long *)((long)GA[g_a + 1000].block_dims + lVar29 * 2);
                *(long *)(err_string + lVar29 * 2) = lVar15 * iVar11 + 1;
                lVar15 = ((long)iVar11 + 1) * lVar15;
                *(long *)((long)_hi + lVar29 * 2) = lVar15;
                lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar29 * 2);
                if (lVar27 <= lVar15) {
                  lVar15 = lVar27;
                }
                *(long *)((long)_hi + lVar29 * 2) = lVar15;
                lVar29 = lVar29 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar29);
            }
          }
          else if (iVar11 == 4) {
            uVar23 = lVar21 % GA[lVar3].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar5) {
              uVar23 = uVar23 & 0xffffffff;
              lVar29 = 0;
              IVar17 = proc;
              do {
                IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar29];
                uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar29 + 1];
                _index[lVar29 + 1] = (int)uVar23;
                lVar29 = lVar29 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar29);
            }
            if (0 < (short)uVar5) {
              pCVar9 = GA[lVar3].mapc;
              lVar29 = 0;
              iVar11 = 0;
              do {
                iVar20 = *(int *)((long)_index + lVar29);
                lVar15 = (long)iVar11 + (long)iVar20;
                *(C_Integer *)(err_string + lVar29 * 2) = pCVar9[lVar15];
                if ((long)iVar20 < *(long *)((long)GA[lVar3].num_blocks + lVar29 * 2) + -1) {
                  lVar15 = GA[lVar3].mapc[lVar15 + 1] + -1;
                }
                else {
                  lVar15 = *(long *)((long)GA[lVar3].dims + lVar29 * 2);
                }
                *(long *)((long)_hi + lVar29 * 2) = lVar15;
                iVar11 = iVar11 + *(int *)((long)GA[lVar3].num_blocks + lVar29 * 2);
                lVar29 = lVar29 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar29);
            }
          }
          else if (iVar11 == 0) {
            if (GA[lVar3].num_rstrctd == 0) {
              if ((short)uVar5 < 1) {
                lVar29 = 1;
              }
              else {
                lVar29 = 1;
                uVar23 = 0;
                do {
                  lVar29 = lVar29 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar29 <= proc)) {
LAB_00180146:
                if (0 < (short)uVar5) {
                  memset(err_string,0,uVar31 * 8);
LAB_00180180:
                  memset(_hi,0xff,uVar31 * 8);
                }
              }
              else if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                lVar29 = 0;
                uVar23 = 0;
                IVar17 = proc;
                do {
                  lVar27 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar15 = IVar17 % lVar27;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar15 + lVar29];
                  if (lVar15 == lVar27 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar15 + lVar29 + 1] + -1;
                  }
                  lVar29 = lVar29 + lVar27;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar27;
                } while (uVar31 != uVar23);
              }
            }
            else if (proc < GA[lVar3].num_rstrctd) {
              if ((short)uVar5 < 1) {
                lVar29 = 1;
              }
              else {
                lVar29 = 1;
                uVar23 = 0;
                do {
                  lVar29 = lVar29 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar31 != uVar23);
              }
              if ((proc < 0) || (lVar29 <= proc)) goto LAB_00180146;
              if (0 < (short)uVar5) {
                pCVar9 = GA[lVar3].mapc;
                lVar29 = 0;
                uVar23 = 0;
                IVar17 = proc;
                do {
                  lVar27 = (long)GA[g_a + 1000].nblock[uVar23];
                  lVar15 = IVar17 % lVar27;
                  hi_loc[uVar23 - 0x20] = pCVar9[lVar15 + lVar29];
                  if (lVar15 == lVar27 + -1) {
                    CVar25 = GA[g_a + 1000].dims[uVar23];
                  }
                  else {
                    CVar25 = pCVar9[lVar15 + lVar29 + 1] + -1;
                  }
                  lVar29 = lVar29 + lVar27;
                  _hi[uVar23] = CVar25;
                  uVar23 = uVar23 + 1;
                  IVar17 = IVar17 / lVar27;
                } while (uVar31 != uVar23);
              }
            }
            else if (0 < (short)uVar5) {
              memset(err_string,0,(ulong)uVar5 << 3);
              goto LAB_00180180;
            }
          }
          if (uVar31 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar10[lVar3].width[0] * 2 + 1;
          }
          if ((short)uVar5 < 2) {
            lVar29 = 1;
            lVar15 = 0;
          }
          else {
            lVar29 = 1;
            lVar15 = 0;
            lVar27 = 0;
            do {
              lVar15 = lVar15 + plo_rcv[lVar27] * lVar29;
              lVar28 = (_hi[lVar27] - hi_loc[lVar27 + -0x20]) +
                       pgVar10[g_a + 1000].width[lVar27] * 2 + 1;
              ld_loc[lVar27] = lVar28;
              lVar29 = lVar29 * lVar28;
              lVar27 = lVar27 + 1;
            } while (uVar31 - 1 != lVar27);
          }
          *(char **)((long)plVar1 + ndim * 4 + 0x10) =
               pgVar10[lVar3].ptr[proc] +
               (long)pgVar10[lVar3].elemsize * (lVar29 * plo_rcv[uVar31 - 1] + lVar15);
          *(int *)((long)plVar1 + ndim * 4 + 0x28) = iVar6;
          *piVar18 = iVar6;
          if (sVar4 != 1) {
            lVar29 = 0;
            do {
              IVar17 = ld_loc[lVar29];
              iVar11 = piVar18[lVar29] * (int)IVar17;
              piVar18[lVar29] = iVar11;
              *(int *)((long)plVar1 + lVar29 * 4 + lVar22) =
                   (int)IVar17 * *(int *)((long)plVar1 + lVar29 * 4 + lVar22);
              *(int *)((long)puVar19 + (ndim + lVar29 + 9) * 4) = iVar11;
              *(undefined4 *)((long)plVar1 + lVar29 * 4 + ndim * 4 + 0x2c) =
                   *(undefined4 *)((long)plVar1 + lVar29 * 4 + lVar22);
              lVar29 = lVar29 + 1;
            } while (local_4f0 != lVar29);
          }
          lVar22 = 0;
          do {
            *(int *)((long)plVar2 + lVar22 * 4 + 8) =
                 ((int)phi_rcv[lVar22] - (int)plo_rcv[lVar22]) + 1;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          *plVar2 = 1;
          lVar22 = 1;
          lVar29 = 0;
          do {
            lVar22 = lVar22 * ((phi_snd[lVar29] - plo_snd[lVar29]) + 1);
            *plVar2 = lVar22;
            lVar29 = lVar29 + 1;
          } while (ndim != lVar29);
          *plVar2 = *plVar2 * lVar14;
          *(int *)(plVar2 + 1) = (int)plVar2[1] * iVar6;
        }
        if (GA[lVar3].corner_flag != 0) {
          increment[idx] = width[idx] * 2;
        }
        idx = idx + 1;
      } while (idx != ndim);
    }
    free(map);
    free(pdVar13);
  }
  return 1;
}

Assistant:

logical pnga_set_update4_info(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, *bufsize, ndim, increment[MAXDIM];
  Integer *proc_rem_snd, *proc_rem_rcv;
  Integer *length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int *stride_snd, *stride_rcv, *count, cache_size;
  /*int corner_flag;*/
  char **ptr_snd, **ptr_rcv, *cache;
  char *current;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets the arrays that are used to transfer data using
   * the update4. To perform the update, this routine makes use of several
   * copies of indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  cache_size = 2*sizeof(char *)+3*ndim*sizeof(int)+3*sizeof(Integer);
  cache_size = 2* ndim *((cache_size/8) + 1) + 1;
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  /*corner_flag = GA[handle].corner_flag;*/
#if GHOST_PRINT
      printf("p[%d]a cache_size: %d\n",GAme,cache_size);
#endif

  /* initialize range increments and get array dimensions */

  pnga_distribution(g_a,me,lo_loc,hi_loc);
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) {
      *(char**)cache = NULL;
      return FALSE;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = (Integer*)cache;
#if GHOST_PRINT
      printf("p[%d]a initial pointer: %d\n",GAme,(Integer)bufsize);
      fflush(stdout);
#endif
  current = (char*)(bufsize+1);

  *bufsize = size*buflen;
#if GHOST_PRINT
      printf("p[%d]a buflen: %d size: %d bufsize: %d\n",GAme,buflen,size,*bufsize);
      fflush(stdout);
#endif

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;

#if GHOST_PRINT
      printf("p[%d]a 1: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;
#if GHOST_PRINT
      printf("p[%d]a 2: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }
#if GHOST_PRINT
      printf("p[%d]a final pointer: %d\n",GAme,(Integer)(Integer*)current);
      fflush(stdout);
#endif
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}